

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.hpp
# Opt level: O2

difference_type
ranges::
concat_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>>
::cursor<true>::distance_to_<0ul>(long *param_1,long param_2)

{
  long lVar1;
  double *pdVar2;
  difference_type dVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *p_Var4;
  
  if (param_1[2] != 0) {
    dVar3 = distance_to_<1ul>(param_1,param_2);
    return dVar3;
  }
  if (*(long *)(param_2 + 0x10) == 0) {
    p_Var4 = ranges::detail::_adl_get_::
             adl_get<0ul,ranges::variant<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>const&>
                       ((variant<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                         *)(param_1 + 1));
    pdVar2 = p_Var4->_M_current;
    p_Var4 = ranges::detail::_adl_get_::
             adl_get<0ul,ranges::variant<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>const&>
                       ((variant<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                         *)(param_2 + 8));
    dVar3 = (long)p_Var4->_M_current - (long)pdVar2 >> 3;
  }
  else {
    p_Var4 = ranges::detail::_adl_get_::
             adl_get<0ul,ranges::variant<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>const&>
                       ((variant<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                         *)(param_1 + 1));
    lVar1 = *(long *)(*(long *)(*param_1 + 0x10) + 8);
    pdVar2 = p_Var4->_M_current;
    dVar3 = distance_to_<1ul>(param_1,param_2);
    dVar3 = dVar3 + (lVar1 - (long)pdVar2 >> 3);
  }
  return dVar3;
}

Assistant:

static difference_type distance_to_(meta::size_t<N>, cursor const & from,
                                                cursor const & to)
            {
                if(from.its_.index() > N)
                    return cursor::distance_to_(meta::size_t<N + 1>{}, from, to);
                if(from.its_.index() == N)
                {
                    if(to.its_.index() == N)
                        return distance(ranges::get<N>(from.its_),
                                        ranges::get<N>(to.its_));
                    return distance(ranges::get<N>(from.its_),
                                    end(std::get<N>(from.rng_->rngs_))) +
                           cursor::distance_to_(meta::size_t<N + 1>{}, from, to);
                }
                if(from.its_.index() < N && to.its_.index() > N)
                    return distance(std::get<N>(from.rng_->rngs_)) +
                           cursor::distance_to_(meta::size_t<N + 1>{}, from, to);
                RANGES_EXPECT(to.its_.index() == N);
                return distance(begin(std::get<N>(from.rng_->rngs_)),
                                ranges::get<N>(to.its_));
            }